

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  undefined1 uVar1;
  stbi_uc asVar2 [4];
  int iVar3;
  uint x_00;
  uint uVar4;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  uint *puVar8;
  uint *puVar9;
  undefined8 *puVar10;
  byte *pbVar11;
  stbi_uc *psVar12;
  uchar *puVar13;
  stbi_uc sVar14;
  uint uVar15;
  char *pcVar16;
  undefined1 *puVar17;
  undefined4 uVar18;
  undefined8 unaff_RBP;
  uint uVar19;
  int iVar20;
  undefined4 uVar21;
  undefined8 unaff_R12;
  size_t sVar22;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  uchar raw_data [4];
  size_t local_80;
  stbi_uc local_74 [4];
  uint local_70;
  uint local_6c;
  undefined8 local_68;
  uint *local_60;
  undefined4 local_58;
  uint local_54;
  ulong local_50;
  uint *local_48;
  uint *local_40;
  undefined4 local_38;
  uint local_34;
  
  pbVar7 = s->img_buffer;
  pbVar11 = s->img_buffer_end;
  local_60 = (uint *)x;
  local_48 = (uint *)y;
  local_40 = (uint *)comp;
  local_34 = req_comp;
  if (pbVar7 < pbVar11) {
LAB_0012ee21:
    s->img_buffer = pbVar7 + 1;
    local_68 = (uint *)CONCAT44(local_68._4_4_,(uint)*pbVar7);
    pbVar7 = pbVar7 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar7 = s->img_buffer;
      pbVar11 = s->img_buffer_end;
      goto LAB_0012ee21;
    }
    local_68 = (uint *)((ulong)local_68._4_4_ << 0x20);
  }
  if (pbVar7 < pbVar11) {
LAB_0012ee5c:
    s->img_buffer = pbVar7 + 1;
    uVar18 = (undefined4)CONCAT71((int7)((ulong)unaff_RBP >> 8),*pbVar7 != 0);
    pbVar7 = pbVar7 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar7 = s->img_buffer;
      pbVar11 = s->img_buffer_end;
      goto LAB_0012ee5c;
    }
    uVar18 = 0;
  }
  if (pbVar7 < pbVar11) {
LAB_0012ee90:
    s->img_buffer = pbVar7 + 1;
    local_6c = (uint)CONCAT71((int7)((ulong)pbVar7 >> 8),*pbVar7);
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar7 = s->img_buffer;
      goto LAB_0012ee90;
    }
    local_6c = 0;
  }
  iVar3 = stbi__get16le(s);
  local_54 = stbi__get16le(s);
  pbVar11 = s->img_buffer;
  local_58 = uVar18;
  if (pbVar11 < s->img_buffer_end) {
LAB_0012eee7:
    s->img_buffer = pbVar11 + 1;
    uVar5 = (uint)*pbVar11;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar11 = s->img_buffer;
      goto LAB_0012eee7;
    }
    uVar5 = 0;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  x_00 = stbi__get16le(s);
  uVar4 = stbi__get16le(s);
  uVar23 = (ulong)uVar4;
  pbVar7 = s->img_buffer;
  pbVar11 = s->img_buffer_end;
  if (pbVar7 < pbVar11) {
LAB_0012ef4f:
    s->img_buffer = pbVar7 + 1;
    local_70 = (uint)CONCAT71((int7)((ulong)pbVar7 >> 8),*pbVar7);
    pbVar7 = pbVar7 + 1;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar7 = s->img_buffer;
      pbVar11 = s->img_buffer_end;
      goto LAB_0012ef4f;
    }
    local_70 = 0;
  }
  if (pbVar7 < pbVar11) {
LAB_0012ef82:
    s->img_buffer = pbVar7 + 1;
    bVar25 = (*pbVar7 & 0x20) == 0;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar7 = s->img_buffer;
      goto LAB_0012ef82;
    }
    bVar25 = true;
  }
  local_74[0] = '\0';
  local_74[1] = '\0';
  local_74[2] = '\0';
  local_74[3] = '\0';
  if ((char)local_58 != '\0') {
    if (uVar5 < 0x18) {
      if (uVar5 - 0xf < 2) {
LAB_0012f031:
        local_80 = 3;
        uVar18 = 1;
        uVar21 = 0;
        goto LAB_0012f097;
      }
      if (uVar5 == 8) goto LAB_0012f08b;
    }
    else if ((uVar5 == 0x18) || (uVar5 == 0x20)) {
      local_80 = (size_t)(uVar5 >> 3);
      goto LAB_0012f095;
    }
LAB_0012f1af:
    puVar10 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
    pcVar16 = "bad format";
    goto LAB_0012f586;
  }
  uVar5 = local_70 & 0xff;
  if ((local_70 & 0xff) < 0x10) {
    if ((local_70 & 0xff) != 8) {
      if (uVar5 == 0xf) goto LAB_0012f031;
      goto LAB_0012f1af;
    }
LAB_0012f08b:
    local_80 = 1;
  }
  else if ((uVar5 == 0x20) || (uVar5 == 0x18)) {
    local_80 = (size_t)(byte)((byte)local_70 >> 3);
  }
  else {
    if (uVar5 != 0x10) goto LAB_0012f1af;
    uVar5 = (local_6c & 0xff) - 8;
    if ((byte)local_6c < 8) {
      uVar5 = local_6c & 0xff;
    }
    if (uVar5 != 3) goto LAB_0012f031;
    local_80 = 2;
  }
LAB_0012f095:
  uVar21 = (undefined4)CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
  uVar18 = 0;
LAB_0012f097:
  *local_60 = x_00;
  *local_48 = uVar4;
  uVar5 = (uint)local_80;
  if (local_40 != (uint *)0x0) {
    *local_40 = uVar5;
  }
  iVar6 = stbi__mad3sizes_valid(x_00,uVar4,uVar5,0);
  if (iVar6 == 0) {
    puVar10 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
    pcVar16 = "too large";
    goto LAB_0012f586;
  }
  puVar8 = (uint *)stbi__malloc_mad3(x_00,uVar4,uVar5,0);
  if (puVar8 == (uint *)0x0) {
LAB_0012f573:
    puVar10 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
    pcVar16 = "outofmem";
    goto LAB_0012f586;
  }
  local_48 = (uint *)CONCAT44(local_48._4_4_,uVar21);
  bVar24 = (byte)local_6c < 8;
  local_60 = puVar8;
  stbi__skip(s,(int)local_68);
  uVar15 = local_54;
  puVar8 = local_60;
  local_50 = uVar23;
  local_38 = uVar18;
  if (((char)local_58 == '\0' && (char)uVar18 == '\0') && bVar24) {
    if (uVar4 != 0) {
      uVar15 = 0;
      do {
        uVar4 = uVar4 - 1;
        uVar19 = uVar15;
        if (bVar25) {
          uVar19 = uVar4;
        }
        stbi__getn(s,(stbi_uc *)((long)(int)(uVar19 * uVar5 * x_00) + (long)puVar8),uVar5 * x_00);
        uVar15 = uVar15 + 1;
      } while (uVar4 != 0);
    }
    goto LAB_0012f4e1;
  }
  if ((char)local_58 == '\0') {
    local_68 = (uint *)0x0;
    puVar9 = local_68;
  }
  else {
    puVar9 = local_60;
    if (local_54 == 0) {
LAB_0012f551:
      free(puVar9);
      puVar10 = (undefined8 *)__tls_get_addr(&PTR_00160d40);
      pcVar16 = "bad palette";
LAB_0012f586:
      *puVar10 = pcVar16;
      return (void *)0x0;
    }
    stbi__skip(s,iVar3);
    puVar9 = (uint *)stbi__malloc_mad2(uVar15,uVar5,0);
    if (puVar9 == (uint *)0x0) {
      free(puVar8);
      goto LAB_0012f573;
    }
    if ((char)local_48 == '\0') {
      puVar17 = (undefined1 *)((long)puVar9 + 2);
      local_68 = puVar9;
      do {
        uVar4 = stbi__get16le(s);
        puVar17[-2] = (char)(((uVar4 >> 10 & 0x1f) * 0xff) / 0x1f);
        puVar17[-1] = (char)(((uVar4 >> 5 & 0x1f) * 0xff) / 0x1f);
        *puVar17 = (char)(((uVar4 & 0x1f) * 0xff) / 0x1f);
        puVar17 = puVar17 + local_80;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
      uVar4 = (uint)local_50;
      puVar8 = local_60;
      puVar9 = local_68;
    }
    else {
      iVar3 = stbi__getn(s,(stbi_uc *)puVar9,uVar5 * uVar15);
      if (iVar3 == 0) {
        free(puVar8);
        goto LAB_0012f551;
      }
    }
  }
  local_68 = puVar9;
  if (uVar4 * x_00 != 0) {
    local_40 = (uint *)(ulong)(uVar4 * x_00);
    bVar24 = true;
    puVar9 = (uint *)0x0;
    uVar4 = 0;
    iVar3 = 0;
    do {
      if ((byte)local_6c < 8) {
LAB_0012f2cb:
        if ((char)local_58 == '\0') {
          if ((char)local_48 == '\0') {
            uVar15 = stbi__get16le(s);
            asVar2 = local_74;
            local_74[1] = (char)(((uVar15 >> 5 & 0x1f) * 0xff) / 0x1f);
            local_74[0] = (char)(((uVar15 >> 10 & 0x1f) * 0xff) / 0x1f);
            local_74[3] = asVar2[3];
            local_74[2] = (char)(((uVar15 & 0x1f) * 0xff) / 0x1f);
          }
          else {
            if (uVar5 == 0) goto LAB_0012f43e;
            psVar12 = s->img_buffer;
            sVar22 = 0;
            do {
              if (psVar12 < s->img_buffer_end) {
LAB_0012f356:
                s->img_buffer = psVar12 + 1;
                sVar14 = *psVar12;
                psVar12 = psVar12 + 1;
              }
              else {
                if (s->read_from_callbacks != 0) {
                  stbi__refill_buffer(s);
                  psVar12 = s->img_buffer;
                  goto LAB_0012f356;
                }
                sVar14 = '\0';
              }
              local_74[sVar22] = sVar14;
              sVar22 = sVar22 + 1;
              puVar8 = local_60;
            } while (local_80 != sVar22);
          }
          goto LAB_0012f41f;
        }
        if ((char)local_70 == '\b') {
          pbVar11 = s->img_buffer;
          if (s->img_buffer_end <= pbVar11) {
            if (s->read_from_callbacks == 0) {
              uVar15 = 0;
              goto LAB_0012f386;
            }
            stbi__refill_buffer(s);
            pbVar11 = s->img_buffer;
          }
          s->img_buffer = pbVar11 + 1;
          uVar15 = (uint)*pbVar11;
        }
        else {
          uVar15 = stbi__get16le(s);
        }
LAB_0012f386:
        if (uVar5 != 0) {
          if (local_54 <= uVar15) {
            uVar15 = 0;
          }
          memcpy(local_74,(void *)((ulong)(uVar15 * uVar5) + (long)local_68),local_80);
          goto LAB_0012f426;
        }
      }
      else {
        if (iVar3 == 0) {
          pbVar11 = s->img_buffer;
          if (pbVar11 < s->img_buffer_end) {
LAB_0012f2b0:
            s->img_buffer = pbVar11 + 1;
            uVar4 = (uint)*pbVar11;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar11 = s->img_buffer;
              goto LAB_0012f2b0;
            }
            uVar4 = 0;
          }
          iVar3 = (uVar4 & 0x7f) + 1;
          uVar4 = uVar4 >> 7;
          goto LAB_0012f2cb;
        }
        bVar26 = uVar4 != 0;
        uVar4 = 1;
        if (!bVar26 || bVar24) {
          uVar4 = (uint)bVar26;
          goto LAB_0012f2cb;
        }
LAB_0012f41f:
        if (uVar5 != 0) {
LAB_0012f426:
          memcpy((void *)((ulong)(uVar5 * (int)puVar9) + (long)puVar8),local_74,local_80);
        }
      }
LAB_0012f43e:
      iVar3 = iVar3 + -1;
      puVar9 = (uint *)((long)puVar9 + 1);
      bVar24 = false;
    } while (puVar9 != local_40);
  }
  if (bVar25 && (int)local_50 != 0) {
    iVar3 = uVar5 * x_00;
    uVar15 = (int)local_50 - 1;
    iVar6 = iVar3 * uVar15;
    uVar19 = 0;
    uVar4 = 0;
    do {
      if (iVar3 != 0) {
        puVar9 = puVar8;
        iVar20 = iVar3 + 1;
        do {
          uVar1 = *(undefined1 *)((long)puVar9 + (ulong)uVar19);
          *(undefined1 *)((long)puVar9 + (ulong)uVar19) =
               *(undefined1 *)((long)puVar9 + (long)iVar6);
          *(undefined1 *)((long)puVar9 + (long)iVar6) = uVar1;
          puVar9 = (uint *)((long)puVar9 + 1);
          iVar20 = iVar20 + -1;
        } while (1 < iVar20);
      }
      iVar6 = iVar6 - iVar3;
      uVar19 = uVar19 + iVar3;
      bVar25 = uVar4 != uVar15 >> 1;
      uVar4 = uVar4 + 1;
    } while (bVar25);
  }
  if (local_68 != (uint *)0x0) {
    free(local_68);
  }
LAB_0012f4e1:
  if (((char)local_38 == '\0' && 2 < uVar5) && (iVar3 = (uint)local_50 * x_00, iVar3 != 0)) {
    puVar17 = (undefined1 *)((long)puVar8 + 2);
    do {
      uVar1 = puVar17[-2];
      puVar17[-2] = *puVar17;
      *puVar17 = uVar1;
      puVar17 = puVar17 + local_80;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  if (local_34 == 0) {
    return puVar8;
  }
  if (uVar5 == local_34) {
    return puVar8;
  }
  puVar13 = stbi__convert_format((uchar *)puVar8,uVar5,local_34,x_00,(uint)local_50);
  return puVar13;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   if (tga_height > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (tga_width > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         if (tga_palette_len == 0) {  /* you have to have at least one entry! */
            STBI_FREE(tga_data);
            return stbi__errpuc("bad palette", "Corrupt TGA");
         }

         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}